

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.cpp
# Opt level: O0

void __thiscall Assimp::LWS::Element::Parse(Element *this,char **buffer)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  reference pvVar5;
  Logger *this_00;
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [32];
  char *local_90;
  char *cur;
  Element local_78;
  byte local_19;
  char **ppcStack_18;
  bool sub;
  char **buffer_local;
  Element *this_local;
  
  ppcStack_18 = buffer;
  buffer_local = (char **)this;
  do {
    bVar2 = SkipSpacesAndLineEnd<char>(ppcStack_18);
    if (!bVar2) {
      return;
    }
    local_19 = 0;
    if (**ppcStack_18 == '{') {
      *ppcStack_18 = *ppcStack_18 + 1;
      SkipSpaces<char>(ppcStack_18);
      local_19 = 1;
    }
    else if (**ppcStack_18 == '}') {
      return;
    }
    Element(&local_78);
    std::__cxx11::list<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>::push_back
              (&this->children,&local_78);
    ~Element(&local_78);
    local_90 = *ppcStack_18;
    while (bVar2 = IsSpaceOrNewLine<char>(**ppcStack_18), pcVar1 = local_90,
          ((bVar2 ^ 0xffU) & 1) != 0) {
      *ppcStack_18 = *ppcStack_18 + 1;
    }
    uVar4 = (long)*ppcStack_18 - (long)local_90;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,pcVar1,uVar4,&local_b1);
    pvVar5 = std::__cxx11::list<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>::back
                       (&this->children);
    std::__cxx11::string::operator=((string *)pvVar5,local_b0);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    SkipSpaces<char>(ppcStack_18);
    pvVar5 = std::__cxx11::list<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>::back
                       (&this->children);
    bVar2 = std::operator==(pvVar5->tokens,"Plugin");
    if (bVar2) {
      this_00 = DefaultLogger::get();
      Logger::debug(this_00,"LWS: Skipping over plugin-specific data");
      while ((bVar2 = SkipSpacesAndLineEnd<char>(ppcStack_18), bVar2 &&
             (iVar3 = strncmp(*ppcStack_18,"EndPlugin",9), iVar3 != 0))) {
        SkipLine<char>(ppcStack_18);
      }
    }
    else {
      local_90 = *ppcStack_18;
      while (bVar2 = IsLineEnd<char>(**ppcStack_18), pcVar1 = local_90, ((bVar2 ^ 0xffU) & 1) != 0)
      {
        *ppcStack_18 = *ppcStack_18 + 1;
      }
      uVar4 = (long)*ppcStack_18 - (long)local_90;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d8,pcVar1,uVar4,&local_d9);
      pvVar5 = std::__cxx11::list<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>::back
                         (&this->children);
      std::__cxx11::string::operator=((string *)(pvVar5->tokens + 1),local_d8);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
      if ((local_19 & 1) != 0) {
        pvVar5 = std::__cxx11::list<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>::
                 back(&this->children);
        Parse(pvVar5,ppcStack_18);
      }
    }
    SkipLine<char>(ppcStack_18);
  } while( true );
}

Assistant:

void LWS::Element::Parse (const char*& buffer)
{
    for (;SkipSpacesAndLineEnd(&buffer);SkipLine(&buffer)) {

        // begin of a new element with children
        bool sub = false;
        if (*buffer == '{') {
            ++buffer;
            SkipSpaces(&buffer);
            sub = true;
        }
        else if (*buffer == '}')
            return;

        children.push_back(Element());

        // copy data line - read token per token

        const char* cur = buffer;
        while (!IsSpaceOrNewLine(*buffer)) ++buffer;
        children.back().tokens[0] = std::string(cur,(size_t) (buffer-cur));
        SkipSpaces(&buffer);

        if (children.back().tokens[0] == "Plugin")
        {
            ASSIMP_LOG_DEBUG("LWS: Skipping over plugin-specific data");

            // strange stuff inside Plugin/Endplugin blocks. Needn't
            // follow LWS syntax, so we skip over it
            for (;SkipSpacesAndLineEnd(&buffer);SkipLine(&buffer)) {
                if (!::strncmp(buffer,"EndPlugin",9)) {
                    //SkipLine(&buffer);
                    break;
                }
            }
            continue;
        }

        cur = buffer;
        while (!IsLineEnd(*buffer)) ++buffer;
        children.back().tokens[1] = std::string(cur,(size_t) (buffer-cur));

        // parse more elements recursively
        if (sub)
            children.back().Parse(buffer);
    }
}